

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

Font * __thiscall sf::Font::operator=(Font *this,Font *right)

{
  Font *in_RDI;
  Font temp;
  Font *in_stack_ffffffffffffff60;
  void *pvStack_98;
  void *pvStack_90;
  Font *in_stack_ffffffffffffff78;
  Font *in_stack_ffffffffffffff80;
  
  Font(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::swap<void*>(&in_RDI->m_library,(void **)&stack0xffffffffffffff60);
  std::swap<void*>(&in_RDI->m_face,&pvStack_98);
  std::swap<void*>(&in_RDI->m_streamRec,&pvStack_90);
  std::swap<void*>(&in_RDI->m_stroker,(void **)&stack0xffffffffffffff78);
  std::swap<int*>(&in_RDI->m_refCount,(int **)&stack0xffffffffffffff80);
  std::swap<sf::Font::Info>((Info *)in_stack_ffffffffffffff80,(Info *)in_stack_ffffffffffffff78);
  std::
  swap<unsigned_int,sf::Font::Page,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sf::Font::Page>>>
            ((map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
              *)in_stack_ffffffffffffff60,
             (map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
              *)in_RDI);
  std::swap<unsigned_char,std::allocator<unsigned_char>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff60,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  ~Font(in_stack_ffffffffffffff60);
  return in_RDI;
}

Assistant:

Font& Font::operator =(const Font& right)
{
    Font temp(right);

    std::swap(m_library,     temp.m_library);
    std::swap(m_face,        temp.m_face);
    std::swap(m_streamRec,   temp.m_streamRec);
    std::swap(m_stroker,     temp.m_stroker);
    std::swap(m_refCount,    temp.m_refCount);
    std::swap(m_info,        temp.m_info);
    std::swap(m_pages,       temp.m_pages);
    std::swap(m_pixelBuffer, temp.m_pixelBuffer);

    #ifdef SFML_SYSTEM_ANDROID
        std::swap(m_stream, temp.m_stream);
    #endif

    return *this;
}